

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cpp
# Opt level: O0

void __thiscall
duration_as_seconds_back_spaced_Test::TestBody(duration_as_seconds_back_spaced_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_7a0 [8];
  Message local_798 [12];
  int local_78c;
  basic_string_view<char,_std::char_traits<char>_> local_788;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_778;
  rep local_768;
  undefined1 local_760 [8];
  AssertionResult gtest_ar_23;
  Message local_748 [12];
  int local_73c;
  basic_string_view<char,_std::char_traits<char>_> local_738;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_728;
  rep local_718;
  undefined1 local_710 [8];
  AssertionResult gtest_ar_22;
  Message local_6f8 [12];
  int local_6ec;
  basic_string_view<char,_std::char_traits<char>_> local_6e8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_6d8;
  rep local_6c8;
  undefined1 local_6c0 [8];
  AssertionResult gtest_ar_21;
  Message local_6a8 [12];
  int local_69c;
  basic_string_view<char,_std::char_traits<char>_> local_698;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_688;
  rep local_678;
  undefined1 local_670 [8];
  AssertionResult gtest_ar_20;
  Message local_658 [12];
  int local_64c;
  basic_string_view<char,_std::char_traits<char>_> local_648;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_638;
  rep local_628;
  undefined1 local_620 [8];
  AssertionResult gtest_ar_19;
  Message local_608 [12];
  int local_5fc;
  basic_string_view<char,_std::char_traits<char>_> local_5f8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_5e8;
  rep local_5d8;
  undefined1 local_5d0 [8];
  AssertionResult gtest_ar_18;
  Message local_5b8 [12];
  int local_5ac;
  basic_string_view<char,_std::char_traits<char>_> local_5a8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_598;
  rep local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_17;
  Message local_568 [12];
  int local_55c;
  basic_string_view<char,_std::char_traits<char>_> local_558;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_548;
  rep local_538;
  undefined1 local_530 [8];
  AssertionResult gtest_ar_16;
  Message local_518 [12];
  int local_50c;
  basic_string_view<char,_std::char_traits<char>_> local_508;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_4f8;
  rep local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_15;
  Message local_4c8 [12];
  int local_4bc;
  basic_string_view<char,_std::char_traits<char>_> local_4b8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_4a8;
  rep local_498;
  undefined1 local_490 [8];
  AssertionResult gtest_ar_14;
  Message local_478 [12];
  int local_46c;
  basic_string_view<char,_std::char_traits<char>_> local_468;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_458;
  rep local_448;
  undefined1 local_440 [8];
  AssertionResult gtest_ar_13;
  Message local_428 [12];
  int local_41c;
  basic_string_view<char,_std::char_traits<char>_> local_418;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_408;
  rep local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_12;
  Message local_3d8 [12];
  int local_3cc;
  basic_string_view<char,_std::char_traits<char>_> local_3c8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_3b8;
  rep local_3a8;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_11;
  Message local_388 [12];
  int local_37c;
  basic_string_view<char,_std::char_traits<char>_> local_378;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_368;
  rep local_358;
  undefined1 local_350 [8];
  AssertionResult gtest_ar_10;
  Message local_338 [12];
  int local_32c;
  basic_string_view<char,_std::char_traits<char>_> local_328;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_318;
  rep local_308;
  undefined1 local_300 [8];
  AssertionResult gtest_ar_9;
  Message local_2e8 [12];
  int local_2dc;
  basic_string_view<char,_std::char_traits<char>_> local_2d8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_2c8;
  rep local_2b8;
  undefined1 local_2b0 [8];
  AssertionResult gtest_ar_8;
  Message local_298 [12];
  int local_28c;
  basic_string_view<char,_std::char_traits<char>_> local_288;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_278;
  rep local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_7;
  Message local_248 [12];
  int local_23c;
  basic_string_view<char,_std::char_traits<char>_> local_238;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_228;
  rep local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8 [12];
  int local_1ec;
  basic_string_view<char,_std::char_traits<char>_> local_1e8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_1d8;
  rep local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8 [12];
  int local_19c;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_188;
  rep local_178;
  undefined1 local_170 [8];
  AssertionResult gtest_ar_4;
  Message local_158 [12];
  int local_14c;
  basic_string_view<char,_std::char_traits<char>_> local_148;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_138;
  rep local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_3;
  Message local_108 [12];
  int local_fc;
  basic_string_view<char,_std::char_traits<char>_> local_f8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_e8;
  rep local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  Message local_b8 [12];
  int local_ac;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_98;
  rep local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar_1;
  Message local_68 [28];
  int local_4c;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  duration_from_string_result<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> local_38;
  rep local_28;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  duration_as_seconds_back_spaced_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  local_48 = sv("1234 ",5);
  local_38 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (&local_48);
  local_28 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_38.duration);
  local_4c = 0x4d2;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_20,"duration_from_string(\"1234 \"sv).duration.count()","1234",
             &local_28,&local_4c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_68);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x87,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_68);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_68);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_a8 = sv("0s ",3);
  local_98 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (&local_a8);
  local_88 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_98.duration);
  local_ac = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_80,"duration_from_string(\"0s \"sv).duration.count()","0",&local_88,
             &local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(local_b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x88,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_f8 = sv("1s ",3);
  local_e8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                       (&local_f8);
  local_d8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_e8.duration);
  local_fc = 1;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_d0,"duration_from_string(\"1s \"sv).duration.count()","1",&local_d8,
             &local_fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar1) {
    testing::Message::Message(local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  local_148 = sv("5000ms ",7);
  local_138 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_148);
  local_128 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_138.duration);
  local_14c = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_120,"duration_from_string(\"5000ms \"sv).duration.count()","5",
             &local_128,&local_14c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(local_158);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x8a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_158);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_158);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  local_198 = sv("5000000us ",10);
  local_188 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_198);
  local_178 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_188.duration);
  local_19c = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_170,"duration_from_string(\"5000000us \"sv).duration.count()","5",
             &local_178,&local_19c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar1) {
    testing::Message::Message(local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_170);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x8b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  local_1e8 = sv("5000000000ns ",0xd);
  local_1d8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_1e8);
  local_1c8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_1d8.duration);
  local_1ec = 5;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_1c0,"duration_from_string(\"5000000000ns \"sv).duration.count()","5",
             &local_1c8,&local_1ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x8c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  local_238 = sv("1h ",3);
  local_228 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_238);
  local_218 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_228.duration);
  local_23c = 0xe10;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_210,"duration_from_string(\"1h \"sv).duration.count()","3600",
             &local_218,&local_23c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(local_248);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x8d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,local_248);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(local_248);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  local_288 = sv("1hr ",4);
  local_278 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_288);
  local_268 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_278.duration);
  local_28c = 0xe10;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_260,"duration_from_string(\"1hr \"sv).duration.count()","3600",
             &local_268,&local_28c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar1) {
    testing::Message::Message(local_298);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,local_298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(local_298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  local_2d8 = sv("1hour ",6);
  local_2c8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_2d8);
  local_2b8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_2c8.duration);
  local_2dc = 0xe10;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_2b0,"duration_from_string(\"1hour \"sv).duration.count()","3600",
             &local_2b8,&local_2dc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b0);
  if (!bVar1) {
    testing::Message::Message(local_2e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,local_2e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(local_2e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b0);
  local_328 = sv("1hours ",7);
  local_318 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_328);
  local_308 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_318.duration);
  local_32c = 0xe10;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_300,"duration_from_string(\"1hours \"sv).duration.count()","3600",
             &local_308,&local_32c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_300);
  if (!bVar1) {
    testing::Message::Message(local_338);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_300);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,local_338);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(local_338);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_300);
  local_378 = sv("1hrs ",5);
  local_368 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_378);
  local_358 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_368.duration);
  local_37c = 0xe10;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_350,"duration_from_string(\"1hrs \"sv).duration.count()","3600",
             &local_358,&local_37c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(local_388);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_350);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,local_388);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(local_388);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  local_3c8 = sv("1d ",3);
  local_3b8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_3c8);
  local_3a8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_3b8.duration);
  local_3cc = 0x15180;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_3a0,"duration_from_string(\"1d \"sv).duration.count()","86400",
             &local_3a8,&local_3cc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a0);
  if (!bVar1) {
    testing::Message::Message(local_3d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,local_3d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(local_3d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
  local_418 = sv("1day ",5);
  local_408 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_418);
  local_3f8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_408.duration);
  local_41c = 0x15180;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_3f0,"duration_from_string(\"1day \"sv).duration.count()","86400",
             &local_3f8,&local_41c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
  if (!bVar1) {
    testing::Message::Message(local_428);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,local_428);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(local_428);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
  local_468 = sv("1days ",6);
  local_458 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_468);
  local_448 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_458.duration);
  local_46c = 0x15180;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_440,"duration_from_string(\"1days \"sv).duration.count()","86400",
             &local_448,&local_46c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_440);
  if (!bVar1) {
    testing::Message::Message(local_478);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_440);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x94,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,local_478);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(local_478);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_440);
  local_4b8 = sv("1w ",3);
  local_4a8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_4b8);
  local_498 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_4a8.duration);
  local_4bc = 0x93a80;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_490,"duration_from_string(\"1w \"sv).duration.count()","604800",
             &local_498,&local_4bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_490);
  if (!bVar1) {
    testing::Message::Message(local_4c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_490);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,local_4c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(local_4c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_490);
  local_508 = sv("1week ",6);
  local_4f8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_508);
  local_4e8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_4f8.duration);
  local_50c = 0x93a80;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_4e0,"duration_from_string(\"1week \"sv).duration.count()","604800",
             &local_4e8,&local_50c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
  if (!bVar1) {
    testing::Message::Message(local_518);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,local_518);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(local_518);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
  local_558 = sv("1weeks ",7);
  local_548 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_558);
  local_538 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_548.duration);
  local_55c = 0x93a80;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_530,"duration_from_string(\"1weeks \"sv).duration.count()","604800",
             &local_538,&local_55c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_530);
  if (!bVar1) {
    testing::Message::Message(local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_530);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_17.message_,local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_17.message_);
    testing::Message::~Message(local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_530);
  local_5a8 = sv("1mo ",4);
  local_598 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_5a8);
  local_588 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_598.duration);
  local_5ac = 0x282072;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_580,"duration_from_string(\"1mo \"sv).duration.count()","2629746",
             &local_588,&local_5ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(local_5b8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_18.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_18.message_,local_5b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_18.message_);
    testing::Message::~Message(local_5b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  local_5f8 = sv("1mon ",5);
  local_5e8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_5f8);
  local_5d8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_5e8.duration);
  local_5fc = 0x282072;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_5d0,"duration_from_string(\"1mon \"sv).duration.count()","2629746",
             &local_5d8,&local_5fc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5d0);
  if (!bVar1) {
    testing::Message::Message(local_608);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_19.message_,local_608);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_19.message_);
    testing::Message::~Message(local_608);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5d0);
  local_648 = sv("1month ",7);
  local_638 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_648);
  local_628 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_638.duration);
  local_64c = 0x282072;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_620,"duration_from_string(\"1month \"sv).duration.count()","2629746",
             &local_628,&local_64c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_620);
  if (!bVar1) {
    testing::Message::Message(local_658);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_620);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_20.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x9a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_20.message_,local_658);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_20.message_);
    testing::Message::~Message(local_658);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_620);
  local_698 = sv("1months ",8);
  local_688 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_698);
  local_678 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_688.duration);
  local_69c = 0x282072;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_670,"duration_from_string(\"1months \"sv).duration.count()","2629746"
             ,&local_678,&local_69c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_670);
  if (!bVar1) {
    testing::Message::Message(local_6a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_670);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_21.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_21.message_,local_6a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_21.message_);
    testing::Message::~Message(local_6a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_670);
  local_6e8 = sv("1y ",3);
  local_6d8 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_6e8);
  local_6c8 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_6d8.duration);
  local_6ec = 0x1e18558;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_6c0,"duration_from_string(\"1y \"sv).duration.count()","31556952",
             &local_6c8,&local_6ec);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6c0);
  if (!bVar1) {
    testing::Message::Message(local_6f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_6c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_22.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x9c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_22.message_,local_6f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_22.message_);
    testing::Message::~Message(local_6f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_6c0);
  local_738 = sv("1year ",6);
  local_728 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_738);
  local_718 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_728.duration);
  local_73c = 0x1e18558;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_710,"duration_from_string(\"1year \"sv).duration.count()","31556952",
             &local_718,&local_73c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_710);
  if (!bVar1) {
    testing::Message::Message(local_748);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_710);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_23.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_23.message_,local_748);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_23.message_);
    testing::Message::~Message(local_748);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_710);
  local_788 = sv("1years ",7);
  local_778 = jessilib::duration_from_string<std::chrono::duration<long,std::ratio<1l,1l>>>
                        (&local_788);
  local_768 = std::chrono::duration<long,_std::ratio<1L,_1L>_>::count(&local_778.duration);
  local_78c = 0x1e18558;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_760,"duration_from_string(\"1years \"sv).duration.count()","31556952"
             ,&local_768,&local_78c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_760);
  if (!bVar1) {
    testing::Message::Message(local_798);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_760);
    testing::internal::AssertHelper::AssertHelper
              (local_7a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/duration.cpp"
               ,0x9e,pcVar2);
    testing::internal::AssertHelper::operator=(local_7a0,local_798);
    testing::internal::AssertHelper::~AssertHelper(local_7a0);
    testing::Message::~Message(local_798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_760);
  return;
}

Assistant:

TEST(duration, as_seconds_back_spaced) {
	EXPECT_EQ(duration_from_string("1234 "sv).duration.count(), 1234);
	EXPECT_EQ(duration_from_string("0s "sv).duration.count(), 0);
	EXPECT_EQ(duration_from_string("1s "sv).duration.count(), 1);
	EXPECT_EQ(duration_from_string("5000ms "sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string("5000000us "sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string("5000000000ns "sv).duration.count(), 5);
	EXPECT_EQ(duration_from_string("1h "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string("1hr "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string("1hour "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string("1hours "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string("1hrs "sv).duration.count(), 3600);
	EXPECT_EQ(duration_from_string("1d "sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string("1day "sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string("1days "sv).duration.count(), 86400);
	EXPECT_EQ(duration_from_string("1w "sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string("1week "sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string("1weeks "sv).duration.count(), 604800);
	EXPECT_EQ(duration_from_string("1mo "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string("1mon "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string("1month "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string("1months "sv).duration.count(), 2629746);
	EXPECT_EQ(duration_from_string("1y "sv).duration.count(), 31556952);
	EXPECT_EQ(duration_from_string("1year "sv).duration.count(), 31556952);
	EXPECT_EQ(duration_from_string("1years "sv).duration.count(), 31556952);
}